

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

BaseNode * __thiscall asmjit::BaseBuilder::addNode(BaseBuilder *this,BaseNode *node)

{
  uint8_t *puVar1;
  byte bVar2;
  BaseNode *pBVar3;
  BaseNode **ppBVar4;
  BaseNode *extraout_RDX;
  BaseNode *extraout_RDX_00;
  BaseNode *pBVar5;
  BaseNode *pBVar6;
  
  if (node == (BaseNode *)0x0) {
    addNode();
LAB_00112fe4:
    addNode();
LAB_00112fe9:
    addNode();
  }
  else {
    if ((node->field_0).field_0._prev != (BaseNode *)0x0) goto LAB_00112fe4;
    if ((node->field_0).field_0._next != (BaseNode *)0x0) goto LAB_00112fe9;
    if (-1 < (char)(node->field_1)._any._nodeFlags) {
      pBVar3 = this->_cursor;
      if (pBVar3 == (BaseNode *)0x0) {
        if (this->_firstNode == (BaseNode *)0x0) {
          this->_firstNode = node;
          pBVar3 = (BaseNode *)&this->_lastNode;
        }
        else {
          (node->field_0).field_0._next = this->_firstNode;
          (this->_firstNode->field_0).field_0._prev = node;
          pBVar3 = (BaseNode *)&this->_firstNode;
        }
      }
      else {
        pBVar6 = (pBVar3->field_0).field_0._next;
        (node->field_0).field_0._prev = pBVar3;
        (node->field_0).field_0._next = pBVar6;
        (pBVar3->field_0).field_0._next = node;
        pBVar3 = (BaseNode *)&this->_lastNode;
        if (pBVar6 != (BaseNode *)0x0) {
          pBVar3 = pBVar6;
        }
      }
      (pBVar3->field_0).field_0._prev = node;
      puVar1 = &(node->field_1)._any._nodeFlags;
      *puVar1 = *puVar1 | 0x80;
      if ((node->field_1)._any._nodeType == '\x02') {
        this->_dirtySectionLinks = true;
      }
      this->_cursor = node;
      return node;
    }
  }
  addNode();
  if (node == (BaseNode *)0x0) {
    addAfter();
LAB_00113047:
    addAfter();
LAB_0011304c:
    addAfter();
  }
  else {
    if (extraout_RDX == (BaseNode *)0x0) goto LAB_00113047;
    if ((node->field_0).field_0._prev != (BaseNode *)0x0) goto LAB_0011304c;
    if ((node->field_0).field_0._next == (BaseNode *)0x0) {
      pBVar3 = (extraout_RDX->field_0).field_0._next;
      (node->field_0).field_0._prev = extraout_RDX;
      (node->field_0).field_0._next = pBVar3;
      puVar1 = &(node->field_1)._any._nodeFlags;
      *puVar1 = *puVar1 | 0x80;
      if ((node->field_1)._any._nodeType == '\x02') {
        this->_dirtySectionLinks = true;
      }
      (extraout_RDX->field_0).field_0._next = node;
      pBVar6 = (BaseNode *)&this->_lastNode;
      if (pBVar3 != (BaseNode *)0x0) {
        pBVar6 = pBVar3;
      }
      (pBVar6->field_0).field_0._prev = node;
      return node;
    }
  }
  addAfter();
  if (node == (BaseNode *)0x0) {
    addBefore();
LAB_001130b9:
    addBefore();
LAB_001130be:
    addBefore();
LAB_001130c3:
    addBefore();
  }
  else {
    if ((node->field_0).field_0._prev != (BaseNode *)0x0) goto LAB_001130b9;
    if ((node->field_0).field_0._next != (BaseNode *)0x0) goto LAB_001130be;
    bVar2 = (node->field_1)._any._nodeFlags;
    if ((char)bVar2 < '\0') goto LAB_001130c3;
    if (extraout_RDX_00 != (BaseNode *)0x0) {
      if ((char)(extraout_RDX_00->field_1)._any._nodeFlags < '\0') {
        pBVar3 = (extraout_RDX_00->field_0).field_0._prev;
        (node->field_0).field_0._prev = pBVar3;
        (node->field_0).field_0._next = extraout_RDX_00;
        (node->field_1)._any._nodeFlags = bVar2 | 0x80;
        if ((node->field_1)._any._nodeType == '\x02') {
          this->_dirtySectionLinks = true;
        }
        (extraout_RDX_00->field_0).field_0._prev = node;
        ppBVar4 = &(pBVar3->field_0).field_0._next;
        if (pBVar3 == (BaseNode *)0x0) {
          ppBVar4 = &this->_firstNode;
        }
        *ppBVar4 = node;
        return node;
      }
      goto LAB_001130cd;
    }
  }
  addBefore();
LAB_001130cd:
  addBefore();
  if ((char)(node->field_1)._any._nodeFlags < '\0') {
    pBVar3 = (node->field_0).field_0._prev;
    pBVar6 = (node->field_0).field_0._next;
    ppBVar4 = &(pBVar3->field_0).field_0._next;
    if (this->_firstNode == node) {
      ppBVar4 = &this->_firstNode;
    }
    *ppBVar4 = pBVar6;
    pBVar5 = (BaseNode *)&this->_lastNode;
    if (this->_lastNode != node) {
      pBVar5 = pBVar6;
    }
    (pBVar5->field_0).field_0._prev = pBVar3;
    (node->field_0).field_0._prev = (BaseNode *)0x0;
    (node->field_0).field_0._next = (BaseNode *)0x0;
    puVar1 = &(node->field_1)._any._nodeFlags;
    *puVar1 = *puVar1 & 0x7f;
    if ((node->field_1)._any._nodeType == '\x02') {
      this->_dirtySectionLinks = true;
    }
    if (this->_cursor == node) {
      this->_cursor = pBVar3;
      return node;
    }
  }
  return node;
}

Assistant:

BaseNode* BaseBuilder::addNode(BaseNode* node) noexcept {
  ASMJIT_ASSERT(node);
  ASMJIT_ASSERT(!node->_prev);
  ASMJIT_ASSERT(!node->_next);
  ASMJIT_ASSERT(!node->isActive());

  if (!_cursor) {
    if (!_firstNode) {
      _firstNode = node;
      _lastNode = node;
    }
    else {
      node->_next = _firstNode;
      _firstNode->_prev = node;
      _firstNode = node;
    }
  }
  else {
    BaseNode* prev = _cursor;
    BaseNode* next = _cursor->next();

    node->_prev = prev;
    node->_next = next;

    prev->_next = node;
    if (next)
      next->_prev = node;
    else
      _lastNode = node;
  }

  node->addFlags(BaseNode::kFlagIsActive);
  if (node->isSection())
    _dirtySectionLinks = true;

  _cursor = node;
  return node;
}